

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedSwitchBuffers::Cleanup(AdvancedSwitchBuffers *this)

{
  int width;
  int height;
  AdvancedSwitchBuffers *this_local;
  
  width = ShaderStorageBufferObjectBase::getWindowWidth(&this->super_ShaderStorageBufferObjectBase);
  height = ShaderStorageBufferObjectBase::getWindowHeight
                     (&this->super_ShaderStorageBufferObjectBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,width,height);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_fbo);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(5, m_storage_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteFramebuffers(1, &m_fbo);
		glDeleteTextures(1, &m_rt);
		return NO_ERROR;
	}